

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testValidBranch(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetworkLayer *pNVar5;
  ActivationParams *pAVar6;
  NeuralNetwork *pNVar7;
  BranchLayerParams *this_00;
  ostream *poVar8;
  Model m;
  Result res;
  NeuralNetwork nnElse;
  NeuralNetwork nnIf;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"A");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"B");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&nnIf);
  pNVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&nnIf.layers_);
  pAVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar6);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"if_relu");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"B");
  CoreML::Specification::NeuralNetwork::NeuralNetwork(&nnElse);
  pNVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&nnElse.layers_);
  pAVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar6);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"else_relu");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"B");
  pNVar7 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar7->arrayinputshapemapping_ = 1;
  pNVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar7->layers_);
  pAVar6 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar5);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar6);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"condition_producing_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,"cond");
  pNVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar7->layers_);
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_branch(pNVar5);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar5,"branch_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,"cond");
  pNVar7 = CoreML::Specification::BranchLayerParams::mutable_ifbranch(this_00);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar7,&nnIf);
  pNVar7 = CoreML::Specification::BranchLayerParams::mutable_elsebranch(this_00);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar7,&nnElse);
  CoreML::validate<(MLModelType)500>(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (!bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x10e6);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"(res).good()");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&nnElse);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork(&nnIf);
  CoreML::Specification::Model::~Model(&m);
  return (uint)!bVar1;
}

Assistant:

int testValidBranch() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");
    
    // "else" net
    Specification::NeuralNetwork nnElse;
    auto *l2 = nnElse.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("else_relu");
    l2->add_input("A");
    l2->add_output("B");
    
    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");
    
    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);
    branch_layer->mutable_elsebranch()->CopyFrom(nnElse);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_GOOD(res);
    return 0;
}